

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O1

void __thiscall serialize_tests::with_params_base::test_method(with_params_base *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  int iVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  lazy_ostream local_138;
  undefined1 *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  DataStream stream;
  Base b;
  undefined1 local_d0 [24];
  assertion_result local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  undefined **local_98;
  undefined1 local_90;
  undefined1 *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_80;
  ParamsStream<DataStream_&,_serialize_tests::BaseFormat> local_78;
  undefined1 *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  b.m_base_data = '\x0f';
  local_78.m_substream = &stream;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stream.m_read_pos = 0;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.m_params = (BaseFormat *)&RAW;
  Base::Serialize<ParamsStream<DataStream&,serialize_tests::BaseFormat>>(&b,&local_78);
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1b4;
  file.m_begin = (iterator)&local_108;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_118,msg);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<unsigned_char_const*>
            ((string *)&local_58,
             stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_start + stream.m_read_pos,
             stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_finish);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"\x0f");
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar1 == 0);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0._8_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_d0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
       + 0x61;
  local_60 = &local_a0;
  local_78.m_substream = (DataStream *)((ulong)local_78.m_substream & 0xffffffffffffff00);
  local_78.m_params = (BaseFormat *)&PTR__lazy_ostream_013d3d70;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_d0;
  local_d0._0_8_ = "\x0f";
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_013d4430;
  local_88 = boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_a0 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_138,1,2,REQUIRE,0xf35901,(size_t)(local_d0 + 8),0x1b4,&local_78,
             "\"\\x0F\"",&local_98);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  b.m_base_data = '\0';
  local_78.m_params = (BaseFormat *)&RAW;
  local_78.m_substream = &stream;
  Base::Unserialize<ParamsStream<DataStream&,serialize_tests::BaseFormat>>(&b,&local_78);
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1b8;
  file_00.m_begin = (iterator)&local_148;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_158,
             msg_00);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_d0._0_4_ = 0xf;
  local_58._M_dataplus._M_p._0_1_ = b.m_base_data == '\x0f';
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  local_b8._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_b8.m_message.px = (element_type *)0xf35401;
  local_78.m_substream = (DataStream *)((ulong)local_78.m_substream & 0xffffffffffffff00);
  local_78.m_params = (BaseFormat *)&PTR__lazy_ostream_013d4aa0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_013d3e70;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_a0;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_d0._8_8_ = &b;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(local_d0 + 8);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,&local_138,1,2,REQUIRE,0xf3598a,(size_t)&local_b8,0x1b8,
             &local_78,"0x0F",&local_98);
  this_00 = &local_58.field_2;
  boost::detail::shared_count::~shared_count((shared_count *)&this_00->_M_allocated_capacity);
  if (stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  stream.m_read_pos = 0;
  local_78.m_params = (BaseFormat *)&HEX;
  local_78.m_substream = &stream;
  Base::Serialize<ParamsStream<DataStream&,serialize_tests::BaseFormat>>(&b,&local_78);
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1bd;
  file_01.m_begin = (iterator)&local_168;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_178,
             msg_01);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_58._M_dataplus._M_p = (pointer)this_00;
  std::__cxx11::string::_M_construct<unsigned_char_const*>
            ((string *)&local_58,
             stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_start + stream.m_read_pos,
             stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_finish);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"0f");
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar1 == 0);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0._8_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_d0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
       + 0x61;
  local_78.m_substream = (DataStream *)((ulong)local_78.m_substream & 0xffffffffffffff00);
  local_78.m_params = (BaseFormat *)&PTR__lazy_ostream_013d3d70;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = &local_a0;
  local_d0._0_8_ = "0f";
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_013d5440;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_d0;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_a0 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_138,1,2,REQUIRE,0xf35901,(size_t)(local_d0 + 8),0x1bd,&local_78,
             "\"0f\"",&local_98);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != this_00) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  b.m_base_data = '\0';
  local_78.m_params = (BaseFormat *)&HEX;
  local_78.m_substream = &stream;
  Base::Unserialize<ParamsStream<DataStream&,serialize_tests::BaseFormat>>(&b,&local_78);
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1c1;
  file_02.m_begin = (iterator)&local_188;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_198,
             msg_02);
  local_138.m_empty = false;
  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = "";
  local_58._M_dataplus._M_p._0_1_ = b.m_base_data == '\x0f';
  local_d0._0_4_ = 0xf;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  local_b8._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_b8.m_message.px = (element_type *)0xf35401;
  local_78.m_substream = (DataStream *)((ulong)local_78.m_substream & 0xffffffffffffff00);
  local_78.m_params = (BaseFormat *)&PTR__lazy_ostream_013d4aa0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_013d3e70;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_a0;
  local_d0._8_8_ = &b;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(local_d0 + 8);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,&local_138,1,2,REQUIRE,0xf3598a,(size_t)&local_b8,0x1c1,
             &local_78,"0x0F",&local_98);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_58.field_2._M_allocated_capacity);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(with_params_base)
{
    Base b{0x0F};

    DataStream stream;

    stream << RAW(b);
    BOOST_CHECK_EQUAL(stream.str(), "\x0F");

    b.m_base_data = 0;
    stream >> RAW(b);
    BOOST_CHECK_EQUAL(b.m_base_data, 0x0F);

    stream.clear();

    stream << HEX(b);
    BOOST_CHECK_EQUAL(stream.str(), "0f");

    b.m_base_data = 0;
    stream >> HEX(b);
    BOOST_CHECK_EQUAL(b.m_base_data, 0x0F);
}